

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

int __thiscall HighsCliqueTable::link(HighsCliqueTable *this,char *__from,char *__to)

{
  bool bVar1;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  int __c;
  int __c_00;
  int __c_01;
  int iVar6;
  char *pcVar7;
  int *unaff_retaddr;
  int *in_stack_00000008;
  HighsHashTree<int,_void> *in_stack_00000010;
  HighsInt cliquelen;
  int iVar2;
  
  iVar6 = (int)__from;
  pcVar7 = (char *)(long)iVar6;
  pvVar3 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
           operator[](&this->cliqueentries,(size_type)pcVar7);
  pcVar7 = CliqueVar::index(pvVar3,pcVar7,__c);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     (&this->numcliquesvar,(long)(int)pcVar7);
  *pvVar4 = *pvVar4 + 1;
  pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&this->cliques,(long)(int)__to);
  iVar2 = pvVar5->end;
  pvVar5 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
           operator[](&this->cliques,(long)(int)__to);
  if (iVar2 - pvVar5->start == 2) {
    pcVar7 = (char *)(long)iVar6;
    pvVar3 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::operator[](&this->cliqueentries,(size_type)pcVar7);
    pcVar7 = CliqueVar::index(pvVar3,pcVar7,__c_00);
    std::vector<HighsHashTree<int,_void>,_std::allocator<HighsHashTree<int,_void>_>_>::operator[]
              (&this->invertedHashListSizeTwo,(long)(int)pcVar7);
    bVar1 = HighsHashTree<int,void>::insert<int&>(in_stack_00000010,in_stack_00000008);
    iVar2 = (int)CONCAT71(extraout_var,bVar1);
  }
  else {
    pcVar7 = (char *)(long)iVar6;
    pvVar3 = std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
             ::operator[](&this->cliqueentries,(size_type)pcVar7);
    pcVar7 = CliqueVar::index(pvVar3,pcVar7,__c_01);
    std::vector<HighsHashTree<int,_int>,_std::allocator<HighsHashTree<int,_int>_>_>::operator[]
              (&this->invertedHashList,(long)(int)pcVar7);
    bVar1 = HighsHashTree<int,int>::insert<int&,int&>
                      ((HighsHashTree<int,_int> *)in_stack_00000010,in_stack_00000008,unaff_retaddr)
    ;
    iVar2 = (int)CONCAT71(extraout_var_00,bVar1);
  }
  return iVar2;
}

Assistant:

void HighsCliqueTable::link(HighsInt pos, HighsInt cliqueid) {
  assert(pos >= 0);
  assert(!colDeleted[cliqueentries[pos].col]);
  ++numcliquesvar[cliqueentries[pos].index()];

  HighsInt cliquelen = cliques[cliqueid].end - cliques[cliqueid].start;
  if (cliquelen == 2)
    invertedHashListSizeTwo[cliqueentries[pos].index()].insert(cliqueid);
  else
    invertedHashList[cliqueentries[pos].index()].insert(cliqueid, pos);
}